

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PixieProvider
          (PixieProvider *this,UserInfo *user_info)

{
  NameCache *this_00;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"static://highway",(allocator<char> *)&local_a8);
  provider::AbstractProvider::AbstractProvider(&this->super_AbstractProvider,user_info,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_AbstractProvider).super_Provider.super_Subscriber._vptr_Subscriber =
       (_func_int **)&PTR_Subscribe_00207d48;
  PixieProtocolOptions::PixieProtocolOptions(&this->protocol_options_);
  (this->writer_thread_count_).super___atomic_base<int>._M_i = 0;
  PriceSyncDecoder::PriceSyncDecoder(&this->price_sync_decoder_);
  (this->data_dictionary_)._M_t.
  super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
  ._M_t.
  super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
  .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>._M_head_impl =
       (IDataDictionary *)0x0;
  tools::BlockingQueue<bidfx_public_api::price::pixie::AckData>::BlockingQueue(&this->ack_queue_);
  SubjectSetRegister::SubjectSetRegister(&this->subject_set_register_);
  (this->subscription_interval_).__r = 200;
  (this->last_subscription_check_time_).__d.__r = 0;
  (this->last_write_time_).__d.__r = 0;
  (this->disconnection_triggered_)._M_base._M_i = false;
  if (Log == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"PixieProvider",(allocator<char> *)&local_88);
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_a8,&local_68);
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&Log,
               (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    std::__cxx11::string::~string((string *)&local_68);
  }
  this->user_info_ = user_info;
  this_00 = tools::NameCache::GetDefault();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"PixieProvider",&local_a9);
  tools::NameCache::CreateUniqueName(&local_a8,this_00,&local_88);
  std::__cxx11::string::operator=
            ((string *)&(this->super_AbstractProvider).name_,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

PixieProvider::PixieProvider(UserInfo* user_info) : AbstractProvider(user_info, "static://highway"), protocol_options_(PixieProtocolOptions())
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PixieProvider");
    }

    user_info_ = user_info;
    name_ = NameCache::GetDefault().CreateUniqueName("PixieProvider");
}